

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

char __thiscall
cs_impl::cni_helper<char_(*)(char),_char_(*)(char)>::_call<0>
          (cni_helper<char_(*)(char),_char_(*)(char)> *this,vector *args,sequence<0> *param_2)

{
  char cVar1;
  
  cVar1 = try_convert_and_check<char,_char,_char,_0UL>::convert
                    ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  cVar1 = std::function<char_(char)>::operator()(&this->mFunc,cVar1);
  return cVar1;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}